

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_settop(lua_State *L,int idx)

{
  StkId pTVar1;
  StkId pTVar2;
  int iVar3;
  StkId func;
  int idx_local;
  lua_State *L_local;
  
  pTVar1 = L->ci->func;
  iVar3 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar3 + 1;
  if (iVar3 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xb3,"void lua_settop(lua_State *, int)");
  }
  if (idx < 0) {
    if ((long)L->top - (long)(pTVar1 + 1) >> 4 < (long)-(idx + 1)) {
      __assert_fail("(-(idx+1) <= (L->top - (func + 1))) && \"invalid new top\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xbb,"void lua_settop(lua_State *, int)");
    }
    L->top = L->top + (idx + 1);
  }
  else {
    if ((long)L->stack_last - (long)(pTVar1 + 1) >> 4 < (long)idx) {
      __assert_fail("(idx <= L->stack_last - (func + 1)) && \"new top too large\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xb5,"void lua_settop(lua_State *, int)");
    }
    while (L->top < pTVar1 + (long)idx + 1) {
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      pTVar2->tt_ = 0;
    }
    L->top = pTVar1 + (long)idx + 1;
  }
  iVar3 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar3;
  if (iVar3 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xbe,"void lua_settop(lua_State *, int)");
  }
  return;
}

Assistant:

LUA_API void lua_settop (lua_State *L, int idx) {
  StkId func = L->ci->func;
  lua_lock(L);
  if (idx >= 0) {
    api_check(L, idx <= L->stack_last - (func + 1), "new top too large");
    while (L->top < (func + 1) + idx)
      setnilvalue(L->top++);
    L->top = (func + 1) + idx;
  }
  else {
    api_check(L, -(idx+1) <= (L->top - (func + 1)), "invalid new top");
    L->top += idx+1;  /* 'subtract' index (index is negative) */
  }
  lua_unlock(L);
}